

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O3

void __thiscall QWizard::paintEvent(QWizard *this,QPaintEvent *event)

{
  int iVar1;
  int iVar2;
  long lVar3;
  QWidgetData *pQVar4;
  char cVar5;
  int iVar6;
  QWizardPage *pQVar7;
  long in_FS_OFFSET;
  QPointF local_78;
  QStyle *local_68;
  undefined1 local_58 [16];
  undefined1 *local_48;
  QWidgetData *local_38;
  double local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar3 = *(long *)&(this->super_QDialog).super_QWidget.field_0x8;
  if (*(int *)(lVar3 + 900) == 2) {
    local_78.xp = (qreal)CONCAT44(local_78.xp._4_4_,*(undefined4 *)(lVar3 + 0x340));
    local_58._0_8_ = (QWizardPage *)0x0;
    pQVar7 = QMap<int,_QWizardPage_*>::value
                       ((QMap<int,_QWizardPage_*> *)(lVar3 + 0x2e0),(int *)&local_78,
                        (QWizardPage **)local_58);
    if (pQVar7 != (QWizardPage *)0x0) {
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      lVar3 = *(long *)&(this->super_QDialog).super_QWidget.field_0x8;
      local_38 = (QWidgetData *)CONCAT44(local_38._4_4_,*(undefined4 *)(lVar3 + 0x340));
      local_78.xp = 0.0;
      pQVar7 = QMap<int,_QWizardPage_*>::value
                         ((QMap<int,_QWizardPage_*> *)(lVar3 + 0x2e0),(int *)&local_38,
                          (QWizardPage **)&local_78);
      QWizardPage::pixmap((QWizardPage *)local_58,(WizardPixmap)pQVar7);
      cVar5 = QPixmap::isNull();
      if (cVar5 == '\0') {
        local_68 = (QStyle *)&DAT_aaaaaaaaaaaaaaaa;
        local_78.xp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
        local_78.yp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
        QPainter::QPainter((QPainter *)&local_78);
        local_78.yp = (qreal)this;
        local_68 = QWidget::style((QWidget *)this);
        QPainter::begin((QPaintDevice *)&local_78);
        QPainter::setRenderHint((RenderHint)&local_78,true);
        pQVar4 = (this->super_QDialog).super_QWidget.data;
        iVar1 = (pQVar4->crect).y1.m_i;
        iVar2 = (pQVar4->crect).y2.m_i;
        iVar6 = QPixmap::height();
        iVar6 = iVar6 + iVar1;
        local_30 = (double)(((iVar2 - iVar6) - ((iVar2 - iVar6) + 1 >> 0x1f)) + 1 >> 1);
        local_38 = (QWidgetData *)0x0;
        QPainter::drawPixmap(&local_78,(QPixmap *)&local_38);
        QPainter::~QPainter((QPainter *)&local_78);
      }
      QPixmap::~QPixmap((QPixmap *)local_58);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWizard::paintEvent(QPaintEvent * event)
{
    Q_D(QWizard);
    if (d->wizStyle == MacStyle && currentPage()) {
        QPixmap backgroundPixmap = currentPage()->pixmap(BackgroundPixmap);
        if (backgroundPixmap.isNull())
            return;

        QStylePainter painter(this);
        painter.drawPixmap(0, (height() - backgroundPixmap.height()) / 2, backgroundPixmap);
    }
#if QT_CONFIG(style_windowsvista)
    else if (d->isVistaThemeEnabled()) {
        d->vistaHelper->paintEvent(event);
    }
#else
    Q_UNUSED(event);
#endif
}